

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_file.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::FileGenerator::GenerateInlineFunctionDefinitions
          (FileGenerator *this,Printer *printer)

{
  size_type sVar1;
  reference this_00;
  pointer this_01;
  int local_64;
  int local_60;
  int i_1;
  int i;
  undefined1 local_50 [8];
  Formatter format;
  Printer *printer_local;
  FileGenerator *this_local;
  
  format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)printer;
  Formatter::Formatter((Formatter *)local_50,printer,&this->variables_);
  Formatter::operator()<>
            ((Formatter *)local_50,
             "#ifdef __GNUC__\n  #pragma GCC diagnostic push\n  #pragma GCC diagnostic ignored \"-Wstrict-aliasing\"\n#endif  // __GNUC__\n"
            );
  local_60 = 0;
  while( true ) {
    sVar1 = std::
            vector<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
            ::size(&this->message_generators_);
    if (sVar1 <= (ulong)(long)local_60) break;
    if (0 < local_60) {
      Formatter::operator()<>
                ((Formatter *)local_50,
                 "// -------------------------------------------------------------------\n");
      Formatter::operator()<>((Formatter *)local_50,"\n");
    }
    this_00 = std::
              vector<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
              ::operator[](&this->message_generators_,(long)local_60);
    this_01 = std::
              unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>
              ::operator->(this_00);
    MessageGenerator::GenerateInlineMethods
              (this_01,(Printer *)format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count);
    local_60 = local_60 + 1;
  }
  Formatter::operator()<>
            ((Formatter *)local_50,
             "#ifdef __GNUC__\n  #pragma GCC diagnostic pop\n#endif  // __GNUC__\n");
  local_64 = 0;
  while( true ) {
    sVar1 = std::
            vector<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
            ::size(&this->message_generators_);
    if (sVar1 <= (ulong)(long)local_64) break;
    if (0 < local_64) {
      Formatter::operator()<>
                ((Formatter *)local_50,
                 "// -------------------------------------------------------------------\n");
      Formatter::operator()<>((Formatter *)local_50,"\n");
    }
    local_64 = local_64 + 1;
  }
  Formatter::~Formatter((Formatter *)local_50);
  return;
}

Assistant:

void FileGenerator::GenerateInlineFunctionDefinitions(io::Printer* printer) {
  Formatter format(printer, variables_);
  // TODO(gerbens) remove pragmas when gcc is no longer used. Current version
  // of gcc fires a bogus error when compiled with strict-aliasing.
  format(
      "#ifdef __GNUC__\n"
      "  #pragma GCC diagnostic push\n"
      "  #pragma GCC diagnostic ignored \"-Wstrict-aliasing\"\n"
      "#endif  // __GNUC__\n");
  // Generate class inline methods.
  for (int i = 0; i < message_generators_.size(); i++) {
    if (i > 0) {
      format(kThinSeparator);
      format("\n");
    }
    message_generators_[i]->GenerateInlineMethods(printer);
  }
  format(
      "#ifdef __GNUC__\n"
      "  #pragma GCC diagnostic pop\n"
      "#endif  // __GNUC__\n");

  for (int i = 0; i < message_generators_.size(); i++) {
    if (i > 0) {
      format(kThinSeparator);
      format("\n");
    }
  }
}